

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileParser::cmListFileParser
          (cmListFileParser *this,cmListFile *lf,cmListFileBacktrace *lfbt,cmMessenger *messenger,
          char *filename)

{
  cmListFileLexer *pcVar1;
  char *filename_local;
  cmMessenger *messenger_local;
  cmListFileBacktrace *lfbt_local;
  cmListFile *lf_local;
  cmListFileParser *this_local;
  
  this->ListFile = lf;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,lfbt);
  this->Messenger = messenger;
  this->FileName = filename;
  pcVar1 = cmListFileLexer_New();
  this->Lexer = pcVar1;
  cmListFileFunction::cmListFileFunction(&this->Function);
  return;
}

Assistant:

cmListFileParser::cmListFileParser(cmListFile* lf, cmListFileBacktrace lfbt,
                                   cmMessenger* messenger,
                                   const char* filename)
  : ListFile(lf)
  , Backtrace(std::move(lfbt))
  , Messenger(messenger)
  , FileName(filename)
  , Lexer(cmListFileLexer_New())
{
}